

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::SetPolicy(cmMakefile *this,PolicyID id,PolicyStatus status)

{
  PolicyStatus PVar1;
  PolicyStatus id_00;
  string local_70;
  undefined1 local_40 [8];
  string msg;
  PolicyStatus status_local;
  PolicyID id_local;
  cmMakefile *this_local;
  
  msg.field_2._8_4_ = status;
  msg.field_2._12_4_ = id;
  if ((status != NEW) &&
     (PVar1 = cmPolicies::GetPolicyStatus(id), status = id_00, PVar1 == REQUIRED_ALWAYS)) {
    cmPolicies::GetRequiredAlwaysPolicyError_abi_cxx11_
              ((string *)local_40,(cmPolicies *)(ulong)(uint)msg.field_2._12_4_,id_00);
    IssueMessage(this,FATAL_ERROR,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
    return false;
  }
  if ((msg.field_2._8_4_ == 0) && ((int)msg.field_2._12_4_ < 0x25)) {
    cmPolicies::GetPolicyDeprecatedWarning_abi_cxx11_
              (&local_70,(cmPolicies *)(ulong)(uint)msg.field_2._12_4_,status);
    IssueMessage(this,DEPRECATION_WARNING,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  cmStateSnapshot::SetPolicy(&this->StateSnapshot,msg.field_2._12_4_,msg.field_2._8_4_);
  return true;
}

Assistant:

bool cmMakefile::SetPolicy(cmPolicies::PolicyID id,
                           cmPolicies::PolicyStatus status)
{
  // A REQUIRED_ALWAYS policy may be set only to NEW.
  if (status != cmPolicies::NEW &&
      cmPolicies::GetPolicyStatus(id) == cmPolicies::REQUIRED_ALWAYS) {
    std::string msg = cmPolicies::GetRequiredAlwaysPolicyError(id);
    this->IssueMessage(cmake::FATAL_ERROR, msg);
    return false;
  }

  // Deprecate old policies, especially those that require a lot
  // of code to maintain the old behavior.
  if (status == cmPolicies::OLD && id <= cmPolicies::CMP0036) {
    this->IssueMessage(cmake::DEPRECATION_WARNING,
                       cmPolicies::GetPolicyDeprecatedWarning(id));
  }

  this->StateSnapshot.SetPolicy(id, status);
  return true;
}